

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LightMask.hpp
# Opt level: O1

void __thiscall LightMask::forwardProp(LightMask *this,vector<float,_std::allocator<float>_> *walls)

{
  uint uVar1;
  int iVar2;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  ulong uVar10;
  float *pfVar11;
  long lVar12;
  float *pfVar13;
  float *pfVar14;
  long lVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  
  uVar1 = this->width_;
  uVar5 = (ulong)uVar1;
  if (1 < (long)(int)uVar1) {
    pfVar3 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    fVar18 = *pfVar3;
    uVar10 = 1;
    do {
      fVar16 = pfVar4[uVar10] / 10.0 + this->falloff_;
      fVar17 = pfVar3[uVar10];
      if (1.0 <= fVar16) {
        fVar16 = 1.0;
      }
      if (fVar18 <= fVar17) {
        fVar18 = fVar17;
      }
      fVar19 = 0.0;
      if (0.0 <= fVar17) {
        fVar19 = fVar17;
      }
      if (fVar19 <= fVar18) {
        fVar19 = fVar18;
      }
      fVar18 = fVar19 - fVar16;
      if (fVar18 <= 0.0) {
        fVar18 = 0.0;
      }
      pfVar3[uVar10] = fVar18;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  iVar2 = this->height_;
  if (1 < (long)iVar2) {
    pfVar3 = (this->mask).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    pfVar4 = (walls->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar8 = (long)(int)uVar1;
    pfVar11 = pfVar3 + 1;
    pfVar9 = pfVar4 + lVar8 + 1;
    lVar15 = 1;
    lVar6 = uVar5 << 0x20;
    do {
      lVar12 = lVar15 * (int)uVar1;
      fVar18 = pfVar3[lVar12];
      fVar17 = pfVar4[lVar12] / 10.0 + this->falloff_;
      if (1.0 <= fVar17) {
        fVar17 = 1.0;
      }
      fVar16 = pfVar3[(lVar15 + -1) * lVar8];
      if (pfVar3[(lVar15 + -1) * lVar8] <= fVar18) {
        fVar16 = fVar18;
      }
      fVar19 = 0.0;
      if (0.0 <= fVar18) {
        fVar19 = fVar18;
      }
      if (fVar19 <= fVar16) {
        fVar19 = fVar16;
      }
      fVar19 = fVar19 - fVar17;
      if (fVar19 <= 0.0) {
        fVar19 = 0.0;
      }
      pfVar3[lVar12] = fVar19;
      lVar12 = lVar6;
      lVar7 = uVar5 - 1;
      pfVar13 = pfVar11;
      pfVar14 = pfVar9;
      if (1 < (int)uVar1) {
        do {
          fVar18 = pfVar13[lVar8];
          fVar17 = *(float *)((long)pfVar3 + (lVar12 >> 0x1e));
          fVar16 = *pfVar14 / 10.0 + this->falloff_;
          if (1.0 <= fVar16) {
            fVar16 = 1.0;
          }
          if (fVar17 <= fVar18) {
            fVar17 = fVar18;
          }
          fVar19 = *pfVar13;
          if (*pfVar13 <= fVar18) {
            fVar19 = fVar18;
          }
          if (fVar19 <= fVar17) {
            fVar19 = fVar17;
          }
          fVar19 = fVar19 - fVar16;
          if (fVar19 <= 0.0) {
            fVar19 = 0.0;
          }
          pfVar13[lVar8] = fVar19;
          pfVar13 = pfVar13 + 1;
          lVar12 = lVar12 + 0x100000000;
          pfVar14 = pfVar14 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      lVar15 = lVar15 + 1;
      pfVar11 = pfVar11 + lVar8;
      lVar6 = lVar6 + (uVar5 << 0x20);
      pfVar9 = pfVar9 + lVar8;
    } while (lVar15 != iVar2);
  }
  return;
}

Assistant:

void forwardProp(const std::vector<float>& walls)
    {
        for (int x = 1; x < width_; x++)
        {
            // Only compare to pixel on the left
            mask[idx(x,0)] = computeIntensity(mask[idx(x,0)], mask[idx(x-1, 0)], 0.0f, walls[idx(x,0)]);
        }
        for (int y = 1; y < height_; y++)
        {
            // First pixel
            // Only compare to pixel above
            mask[idx(0,y)] = computeIntensity(mask[idx(0,y)], mask[idx(0, y-1)], 0.0f, walls[idx(0,y)] );

            // All other pixels: compare to pixel above and to the left
            for (int x = 1; x < width_; x++)
            {
                mask[idx(x,y)] = computeIntensity(
                        mask[ idx(x,   y)],
                        mask[ idx(x-1, y)],
                        mask[ idx(x,   y-1)],
                        walls[idx(x,   y)] );
            }
        }
    }